

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTileDescriptionAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::TileDescription>::readValueFrom
          (TypedAttribute<Imf_2_5::TileDescription> *this,IStream *is,int size,int version)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  uchar tmp;
  
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).xSize);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,&(this->_value).ySize);
  (*is->_vptr_IStream[3])(is,&tmp,1);
  bVar1 = tmp >> 4;
  bVar2 = tmp & 0xf;
  uVar3 = (ulong)CONCAT14((2 < bVar1) * '\x02' | (2 >= bVar1) * bVar1,
                          (uint)(byte)((3 < bVar2) * '\x03' | (3 >= bVar2) * bVar2));
  (this->_value).mode = (int)uVar3;
  (this->_value).roundingMode = (int)(uVar3 >> 0x20);
  return;
}

Assistant:

void
TileDescriptionAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
					 int size,
					 int version)
{
    Xdr::read <StreamIO> (is, _value.xSize);
    Xdr::read <StreamIO> (is, _value.ySize);

    unsigned char tmp;
    Xdr::read <StreamIO> (is, tmp);

    //
    // four bits are allocated for 'mode' for future use (16 possible values)
    // but only values 0,1,2 are currently valid. '3' is a special valid enum value
    // that indicates bad values have been used
    //
    // roundingMode can only be 0 or 1, and 2 is a special enum value for 'bad enum'
    //
    unsigned char levelMode = tmp & 0x0f;
    if(levelMode > 3)
    {
        levelMode = 3;
    }

    _value.mode = LevelMode(levelMode);

    unsigned char levelRoundingMode = (tmp >> 4) & 0x0f;
    if(levelRoundingMode > 2)
    {
        levelRoundingMode = 2;
    }

    _value.roundingMode = LevelRoundingMode (levelRoundingMode);
    
}